

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Compilation.cpp
# Opt level: O0

string_view __thiscall
slang::ast::Compilation::checkDPIMethods::anon_class_1_0_00000001::operator()
          (anon_class_1_0_00000001 *this,Scope *scope,Token cid,Token name)

{
  string_view sVar1;
  bool bVar2;
  const_reference pvVar3;
  char *in_RSI;
  string_view sVar4;
  basic_string_view<char,_std::char_traits<char>_> tail;
  string_view text;
  Scope *in_stack_000000a8;
  undefined1 in_stack_000000b0 [16];
  DiagCode in_stack_000000c4;
  Token *in_stack_ffffffffffffff80;
  undefined1 in_stack_ffffffffffffff88 [16];
  Token *this_00;
  basic_string_view<char,_std::char_traits<char>_> local_60;
  Diagnostic *this_01;
  char *pcVar5;
  basic_string_view<char,_std::char_traits<char>_> local_10;
  
  bVar2 = parsing::Token::operator_cast_to_bool((Token *)0x355652);
  if (bVar2) {
    sVar4 = parsing::Token::valueText(in_stack_ffffffffffffff80);
    this_01 = (Diagnostic *)sVar4._M_len;
    pcVar5 = sVar4._M_str;
  }
  else {
    sVar4 = parsing::Token::valueText(in_stack_ffffffffffffff80);
    this_01 = (Diagnostic *)sVar4._M_len;
    pcVar5 = sVar4._M_str;
  }
  bVar2 = std::basic_string_view<char,_std::char_traits<char>_>::empty
                    ((basic_string_view<char,_std::char_traits<char>_> *)&stack0xffffffffffffffb0);
  this_00 = in_stack_ffffffffffffff88._8_8_;
  if (!bVar2) {
    local_60 = std::basic_string_view<char,_std::char_traits<char>_>::substr
                         ((basic_string_view<char,_std::char_traits<char>_> *)this_00,
                          in_stack_ffffffffffffff88._0_8_,(size_type)in_stack_ffffffffffffff80);
    std::basic_string_view<char,_std::char_traits<char>_>::operator[]
              ((basic_string_view<char,_std::char_traits<char>_> *)&stack0xffffffffffffffb0,0);
    bVar2 = isValidCIdChar('\0');
    if (bVar2) {
      pvVar3 = std::basic_string_view<char,_std::char_traits<char>_>::operator[]
                         ((basic_string_view<char,_std::char_traits<char>_> *)
                          &stack0xffffffffffffffb0,0);
      bVar2 = isDecimalDigit(*pvVar3);
      if ((!bVar2) &&
         (bVar2 = std::ranges::__any_of_fn::
                  operator()<std::basic_string_view<char,_std::char_traits<char>_>_&,_std::identity,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_MikePopoloski[P]slang_source_ast_Compilation_cpp:1888:43)>
                            ((__any_of_fn *)&std::ranges::any_of,&local_60), !bVar2))
      goto LAB_003557bb;
    }
    bVar2 = parsing::Token::operator_cast_to_bool((Token *)0x355722);
    if (bVar2) {
      parsing::Token::range(this_00);
    }
    else {
      parsing::Token::range(this_00);
    }
    Scope::addDiag(in_stack_000000a8,in_stack_000000c4,(SourceRange)in_stack_000000b0);
    sVar4._M_str = in_RSI;
    sVar4._M_len = (size_t)pcVar5;
    Diagnostic::operator<<(this_01,sVar4);
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_10);
    this_01 = (Diagnostic *)local_10._M_len;
    pcVar5 = local_10._M_str;
  }
LAB_003557bb:
  local_10._M_str = pcVar5;
  local_10._M_len = (size_t)this_01;
  sVar1._M_str = local_10._M_str;
  sVar1._M_len = local_10._M_len;
  return sVar1;
}

Assistant:

void Compilation::checkDPIMethods(std::span<const SubroutineSymbol* const> dpiImports) {
    auto getCId = [&](const Scope& scope, Token cid, Token name) {
        std::string_view text = cid ? cid.valueText() : name.valueText();
        if (!text.empty()) {
            auto tail = text.substr(1);
            if (!isValidCIdChar(text[0]) || isDecimalDigit(text[0]) ||
                std::ranges::any_of(tail, [](char c) { return !isValidCIdChar(c); })) {
                scope.addDiag(diag::InvalidDPICIdentifier, cid ? cid.range() : name.range())
                    << text;
                return std::string_view();
            }
        }
        return text;
    };

    flat_hash_map<std::string_view, const SubroutineSymbol*> nameMap;
    for (auto sub : dpiImports) {
        auto syntax = sub->getSyntax();
        SLANG_ASSERT(syntax);

        auto scope = sub->getParentScope();
        SLANG_ASSERT(scope);

        auto& dis = syntax->as<DPIImportSyntax>();
        std::string_view cId = getCId(*scope, dis.c_identifier, dis.method->name->getLastToken());
        if (cId.empty())
            continue;

        auto [it, inserted] = nameMap.emplace(cId, sub);
        if (!inserted) {
            if (!checkSignaturesMatch(*sub, *it->second)) {
                auto& diag = scope->addDiag(diag::DPISignatureMismatch, sub->location);
                diag << cId;
                diag.addNote(diag::NotePreviousDefinition, it->second->location);
            }
        }
    }

    flat_hash_map<std::tuple<std::string_view, const Scope*>, const DPIExportSyntax*>
        exportsByScope;
    flat_hash_map<const SubroutineSymbol*, const DPIExportSyntax*> previousExports;
    auto exports = dpiExports;
    for (auto [syntax, scope] : exports) {
        if (syntax->specString.valueText() == "DPI")
            scope->addDiag(diag::DPISpecDisallowed, syntax->specString.range());

        auto name = syntax->name.valueText();
        auto symbol = Lookup::unqualifiedAt(*scope, name, LookupLocation::max,
                                            syntax->name.range());
        if (!symbol)
            continue;

        if (symbol->kind != SymbolKind::Subroutine) {
            auto& diag = scope->addDiag(diag::NotASubroutine, syntax->name.range()) << name;
            diag.addNote(diag::NoteDeclarationHere, symbol->location);
            continue;
        }

        // This check is a little verbose because we're avoiding issuing an error if the
        // functionOrTask keyword is invalid, i.e. not 'function' or 'task'.
        auto& sub = symbol->as<SubroutineSymbol>();
        if ((sub.subroutineKind == SubroutineKind::Function &&
             syntax->functionOrTask.kind == TokenKind::TaskKeyword) ||
            (sub.subroutineKind == SubroutineKind::Task &&
             syntax->functionOrTask.kind == TokenKind::FunctionKeyword)) {
            auto& diag = scope->addDiag(diag::DPIExportKindMismatch,
                                        syntax->functionOrTask.range());
            diag.addNote(diag::NoteDeclarationHere, symbol->location);
            continue;
        }

        if (sub.getParentScope() != scope) {
            auto& diag = scope->addDiag(diag::DPIExportDifferentScope, syntax->name.range());
            diag.addNote(diag::NoteDeclarationHere, sub.location);
            continue;
        }

        if (sub.flags.has(MethodFlags::DPIImport)) {
            auto& diag = scope->addDiag(diag::DPIExportImportedFunc, syntax->name.range());
            diag.addNote(diag::NoteDeclarationHere, sub.location);
            continue;
        }

        auto& retType = sub.getReturnType();
        if (!retType.isValidForDPIReturn() && !retType.isError()) {
            auto& diag = scope->addDiag(diag::InvalidDPIReturnType, sub.location);
            diag << retType;
            diag.addNote(diag::NoteDeclarationHere, syntax->name.location());
            continue;
        }

        for (auto arg : sub.getArguments()) {
            if (arg->direction == ArgumentDirection::Ref)
                scope->addDiag(diag::DPIRefArg, arg->location);

            auto& type = arg->getType();
            if (!type.isValidForDPIArg() && !type.isError()) {
                auto& diag = scope->addDiag(diag::InvalidDPIArgType, arg->location);
                diag << type;
                diag.addNote(diag::NoteDeclarationHere, syntax->name.location());
                continue;
            }
        }

        {
            auto [it, inserted] = previousExports.emplace(&sub, syntax);
            if (!inserted) {
                auto& diag = scope->addDiag(diag::DPIExportDuplicate, syntax->name.range())
                             << sub.name;
                diag.addNote(diag::NotePreviousDefinition, it->second->name.location());
                continue;
            }
        }

        std::string_view cId = getCId(*scope, syntax->c_identifier, syntax->name);
        if (!cId.empty()) {
            {
                auto [it, inserted] = nameMap.emplace(cId, &sub);
                if (!inserted) {
                    if (!checkSignaturesMatch(sub, *it->second)) {
                        auto& diag = scope->addDiag(diag::DPISignatureMismatch,
                                                    syntax->name.range());
                        diag << cId;
                        diag.addNote(diag::NotePreviousDefinition, it->second->location);
                    }
                }
            }
            {
                auto [it, inserted] = exportsByScope.emplace(std::make_tuple(cId, scope), syntax);
                if (!inserted) {
                    auto& diag = scope->addDiag(diag::DPIExportDuplicateCId, syntax->name.range());
                    diag << cId;
                    diag.addNote(diag::NotePreviousDefinition, it->second->name.location());
                }
            }
        }
    }
}